

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O3

void print_path_segment_walker(char *segment,void *void_memo)

{
  size_t sVar1;
  
  sVar1 = strlen(suite_path);
  __strncat_chk(suite_path,segment,0xfff - sVar1,0x1000);
  if (0 < *(int *)((long)void_memo + 8)) {
    __strcat_chk(suite_path,"/",0x1000);
    *(int *)((long)void_memo + 8) = *(int *)((long)void_memo + 8) + -1;
  }
  return;
}

Assistant:

static void print_path_segment_walker(const char *segment, void *void_memo) {
    XmlMemo *memo = (XmlMemo *)void_memo;

    strncat(suite_path, segment, sizeof(suite_path)-strlen(suite_path)-1);
    print_path_separator_if_needed(&memo->segment_count);
}